

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O0

void tokenize_vartx(ThreadData_conflict *td,TX_SIZE tx_size,BLOCK_SIZE plane_bsize,int blk_row,
                   int blk_col,int block,int plane,void *arg)

{
  int iVar1;
  BLOCK_SIZE *pBVar2;
  BLOCK_SIZE BVar3;
  int iVar4;
  MACROBLOCKD *xd_00;
  long lVar5;
  int in_ECX;
  BLOCK_SIZE in_DL;
  BLOCK_SIZE in_SIL;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  uint in_stack_0000000c;
  long in_stack_00000010;
  int offsetc;
  int col;
  int offsetr;
  int row;
  int col_end;
  int row_end;
  int step;
  int bsh;
  int bsw;
  TX_SIZE in_stack_00000056;
  TX_SIZE sub_txs;
  tokenize_b_args *args;
  int in_stack_00000060;
  int in_stack_00000064;
  TX_SIZE plane_tx_size;
  int max_blocks_wide;
  int max_blocks_high;
  macroblockd_plane *pd;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  TX_SIZE in_stack_000015f6;
  BLOCK_SIZE in_stack_000015f7;
  int in_stack_000015f8;
  int in_stack_000015fc;
  int in_stack_00001600;
  int in_stack_00001604;
  void *in_stack_00001640;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  int local_90;
  int local_8c;
  int local_74;
  int local_6c;
  undefined2 in_stack_fffffffffffffff4;
  
  xd_00 = (MACROBLOCKD *)(in_RDI + 0x1a0);
  pBVar2 = (BLOCK_SIZE *)**(undefined8 **)(in_RDI + 0x2058);
  lVar5 = in_RDI + 0x1b0 + (long)in_stack_00000008 * 0xa30;
  local_8c = max_block_high(xd_00,in_DL,in_stack_00000008);
  local_90 = max_block_wide(xd_00,in_DL,in_stack_00000008);
  if ((in_ECX < local_8c) && (in_R8D < local_90)) {
    if (in_stack_00000008 == 0) {
      iVar4 = av1_get_txb_size_index(in_DL,in_ECX,in_R8D);
      BVar3 = pBVar2[(long)iVar4 + 0x92];
    }
    else {
      BVar3 = av1_get_max_uv_txsize
                        ((BLOCK_SIZE)((ulong)in_stack_ffffffffffffff60 >> 0x38),
                         (int)in_stack_ffffffffffffff60,
                         (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    }
    if ((in_SIL == BVar3) || (in_stack_00000008 != 0)) {
      get_plane_block_size(*pBVar2,*(int *)(lVar5 + 4),*(int *)(lVar5 + 8));
      if (*(char *)(in_stack_00000010 + 0x14) == '\0') {
        av1_record_txb_context
                  (in_stack_00000064,in_stack_00000060,args._4_4_,(int)args,sub_txs,
                   in_stack_00000056,pd);
      }
      else {
        av1_update_and_record_txb_context
                  (in_stack_00001604,in_stack_00001600,in_stack_000015fc,in_stack_000015f8,
                   in_stack_000015f7,in_stack_000015f6,in_stack_00001640);
      }
    }
    else {
      iVar4 = tx_size_wide_unit[""[in_SIL]];
      iVar1 = tx_size_high_unit[""[in_SIL]];
      if (tx_size_high_unit[in_SIL] < local_8c - in_ECX) {
        local_8c = tx_size_high_unit[in_SIL];
      }
      else {
        local_8c = local_8c - in_ECX;
      }
      if (tx_size_wide_unit[in_SIL] < local_90 - in_R8D) {
        local_90 = tx_size_wide_unit[in_SIL];
      }
      else {
        local_90 = local_90 - in_R8D;
      }
      for (local_6c = 0; local_6c < local_8c; local_6c = iVar1 + local_6c) {
        for (local_74 = 0; local_74 < local_90; local_74 = iVar4 + local_74) {
          tokenize_vartx((ThreadData_conflict *)
                         CONCAT17(in_SIL,CONCAT16(in_DL,CONCAT24(in_stack_fffffffffffffff4,in_ECX)))
                         ,(TX_SIZE)((uint)in_R8D >> 0x18),(BLOCK_SIZE)((uint)in_R8D >> 0x10),in_R9D,
                         (int)((ulong)in_RDI >> 0x20),(int)in_RDI,unaff_retaddr,
                         (void *)((ulong)in_stack_0000000c << 0x20));
          in_R9D = iVar4 * iVar1 + in_R9D;
        }
      }
    }
  }
  return;
}

Assistant:

static void tokenize_vartx(ThreadData *td, TX_SIZE tx_size,
                           BLOCK_SIZE plane_bsize, int blk_row, int blk_col,
                           int block, int plane, void *arg) {
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  const TX_SIZE plane_tx_size =
      plane ? av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                                    pd->subsampling_y)
            : mbmi->inter_tx_size[av1_get_txb_size_index(plane_bsize, blk_row,
                                                         blk_col)];

  if (tx_size == plane_tx_size || plane) {
    plane_bsize =
        get_plane_block_size(mbmi->bsize, pd->subsampling_x, pd->subsampling_y);

    struct tokenize_b_args *args = arg;
    if (args->allow_update_cdf)
      av1_update_and_record_txb_context(plane, block, blk_row, blk_col,
                                        plane_bsize, tx_size, arg);
    else
      av1_record_txb_context(plane, block, blk_row, blk_col, plane_bsize,
                             tx_size, arg);

  } else {
    // Half the block size in transform block unit.
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int step = bsw * bsh;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);

    assert(bsw > 0 && bsh > 0);

    for (int row = 0; row < row_end; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += bsw) {
        const int offsetc = blk_col + col;

        tokenize_vartx(td, sub_txs, plane_bsize, offsetr, offsetc, block, plane,
                       arg);
        block += step;
      }
    }
  }
}